

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2dd(char *cval,double *dval,int *status)

{
  lconv *plVar1;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  int *in_RDX;
  double *in_RSI;
  char *in_RDI;
  double dVar5;
  short iret;
  short *sptr;
  lconv *lcc;
  char tval [73];
  char msg [81];
  char *loc;
  short local_f0;
  char local_d8 [80];
  char local_88 [96];
  char *local_28;
  int *local_20;
  double *local_18;
  char *local_10;
  int local_4;
  
  if (*in_RDX < 1) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (ffc2dd::decimalpt == '\0') {
      plVar1 = localeconv();
      ffc2dd::decimalpt = *plVar1->decimal_point;
    }
    piVar2 = __errno_location();
    *piVar2 = 0;
    *local_18 = 0.0;
    pcVar3 = strchr(local_10,0x44);
    if ((pcVar3 == (char *)0x0) && (ffc2dd::decimalpt != ',')) {
      dVar5 = strtod(local_10,&local_28);
      *local_18 = dVar5;
    }
    else {
      sVar4 = strlen(local_10);
      if (0x48 < sVar4) {
        strcpy(local_88,"Error: Invalid string to double in ffc2dd");
        ffpmsg((char *)0x16fc5e);
        *local_20 = 0x199;
        return 0x199;
      }
      strcpy(local_d8,local_10);
      local_28 = strchr(local_d8,0x44);
      if (local_28 != (char *)0x0) {
        *local_28 = 'E';
      }
      if ((ffc2dd::decimalpt == ',') && (local_28 = strchr(local_d8,0x2e), local_28 != (char *)0x0))
      {
        *local_28 = ',';
      }
      dVar5 = strtod(local_d8,&local_28);
      *local_18 = dVar5;
    }
    if ((*local_28 != '\0') && (*local_28 != ' ')) {
      strcpy(local_88,"Error in ffc2dd converting string to double: ");
      strncat(local_88,local_10,0x1e);
      ffpmsg((char *)0x16fd7f);
      *local_20 = 0x199;
    }
    if ((*(ushort *)((long)local_18 + 6) & 0x7ff0) == 0x7ff0) {
      local_f0 = 1;
    }
    else {
      local_f0 = 0;
      if ((*(ushort *)((long)local_18 + 6) & 0x7ff0) == 0) {
        local_f0 = 2;
      }
    }
    piVar2 = __errno_location();
    if ((*piVar2 == 0x22) || (local_f0 == 1)) {
      strcpy(local_88,"Error in ffc2dd converting string to double: ");
      strncat(local_88,local_10,0x1e);
      ffpmsg((char *)0x16fe35);
      *local_18 = 0.0;
      *local_20 = 0x19c;
      piVar2 = __errno_location();
      *piVar2 = 0;
    }
    local_4 = *local_20;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffc2dd(const char *cval,   /* I - string representation of the value */
           double *dval,       /* O - numerical value of the input string */
           int *status)        /* IO - error status */
/*
  convert null-terminated formatted string to a double value
*/
{
    char *loc, msg[81], tval[73];
    struct lconv *lcc = 0;
    static char decimalpt = 0;
    short *sptr, iret;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!decimalpt) { /* only do this once for efficiency */
       lcc = localeconv();   /* set structure containing local decimal point symbol */
       decimalpt = *(lcc->decimal_point);
    }
   
    errno = 0;
    *dval = 0.;

    if (strchr(cval, 'D') || decimalpt == ',') {
        /* need to modify a temporary copy of the string before parsing it */
        if (strlen(cval) > 72)
        {
           strcpy(msg,"Error: Invalid string to double in ffc2dd");
           ffpmsg(msg);
           return (*status=BAD_C2D);
        }
        strcpy(tval, cval);
        /*  The C language does not support a 'D'; replace with 'E' */
        if ((loc = strchr(tval, 'D'))) *loc = 'E';

        if (decimalpt == ',')  {
            /* strtod expects a comma, not a period, as the decimal point */
            if ((loc = strchr(tval, '.')))  *loc = ',';   
        }
    
        *dval = strtod(tval, &loc);  /* read the string as an double */
    } else {
        *dval = strtod(cval, &loc);
    }

    /* check for read error, or junk following the value */
    if (*loc != '\0' && *loc != ' ' )
    {
        strcpy(msg,"Error in ffc2dd converting string to double: ");
        strncat(msg,cval,30);
        ffpmsg(msg);

        *status = BAD_C2D;   
    }

    sptr = (short *) dval;
#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
    sptr += 3;       /* point to MSBs */
#endif
    iret = dnan(*sptr);  /* if iret == 1, then the double value is a NaN */

    if (errno == ERANGE || (iret == 1) )
    {
        strcpy(msg,"Error in ffc2dd converting string to double: ");
        strncat(msg,cval,30);
        ffpmsg(msg);
	*dval = 0.;

        *status = NUM_OVERFLOW;
        errno = 0;
    }

    return(*status);
}